

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

bool __thiscall
imrt::ApertureILS::acceptanceCriterion(ApertureILS *this,double new_eval,double prev_eval)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  
  if ((this->super_ILS).acceptance == 0) {
    return new_eval < prev_eval;
  }
  dVar4 = exp(-(new_eval - prev_eval) / this->temperature);
  iVar2 = rand();
  bVar1 = (double)iVar2 / 2147483647.0 <= dVar4;
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Accept worst. temperature: ",0x1d);
    poVar3 = std::ostream::_M_insert<double>(this->temperature);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return bVar1;
}

Assistant:

bool ApertureILS::acceptanceCriterion(double new_eval, double prev_eval) {
  if (acceptance==0){
    //Only best solutions
    if (new_eval < prev_eval) return(true);
     return(false);
  } else if (acceptance==1) {
    //SA criterion
    double p = exp((double)-(new_eval-prev_eval)/temperature);
    double r = ((double)rand() / (RAND_MAX));
    if (r <= p){
      cout << "  Accept worst. temperature: "<< temperature<<endl;
      return(true);
    }
    return(false);
  }
}